

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

RPCHelpMan * gettxoutsetinfo(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffdb18;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar2;
  allocator<RPCResult> *paVar3;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffdb20;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffdb28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdb30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdb48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdb50;
  UniValue *in_stack_ffffffffffffdb58;
  UniValue *in_stack_ffffffffffffdb60;
  undefined7 in_stack_ffffffffffffdb68;
  undefined1 in_stack_ffffffffffffdb6f;
  string *in_stack_ffffffffffffdb70;
  undefined7 in_stack_ffffffffffffdb78;
  undefined1 in_stack_ffffffffffffdb7f;
  undefined4 in_stack_ffffffffffffdb80;
  Type in_stack_ffffffffffffdb84;
  string *in_stack_ffffffffffffdb88;
  undefined4 in_stack_ffffffffffffdb90;
  Type in_stack_ffffffffffffdb94;
  undefined4 in_stack_ffffffffffffdb98;
  Type in_stack_ffffffffffffdb9c;
  RPCResult *in_stack_ffffffffffffdba0;
  undefined1 *local_2400;
  undefined1 *local_23e8;
  undefined1 *local_23d0;
  undefined1 *local_23b8;
  RPCExamples *in_stack_ffffffffffffdc60;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_1f30 [35];
  undefined1 local_1f0d;
  undefined1 local_1f0c;
  undefined1 local_1f0b;
  undefined1 local_1f0a [2];
  allocator<char> local_1f08;
  allocator<char> local_1f07;
  allocator<char> local_1f06;
  allocator<char> local_1f05;
  allocator<char> local_1f04;
  allocator<char> local_1f03;
  allocator<char> local_1f02;
  allocator<char> local_1f01;
  allocator<char> local_1f00;
  allocator<char> local_1eff;
  allocator<char> local_1efe;
  allocator<char> local_1efd;
  allocator<char> local_1efc [12];
  undefined1 auStack_1ef0 [23];
  allocator<char> local_1ed9 [31];
  allocator<char> local_1eba;
  allocator<char> local_1eb9 [31];
  allocator<char> local_1e9a;
  allocator<char> local_1e99;
  undefined8 local_1e98;
  _Alloc_hider _Stack_1e90;
  size_type local_1e88;
  undefined1 local_1e7a [32];
  allocator<char> local_1e5a;
  allocator<char> local_1e59;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e58;
  pointer local_1e48;
  allocator<char> local_1e3a;
  allocator<char> local_1e39;
  pointer local_1e38;
  undefined8 uStack_1e30;
  undefined8 local_1e28;
  allocator<char> local_1e1a;
  allocator<char> local_1e19;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  allocator<char> local_1dfa;
  allocator<char> local_1df9;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  allocator<char> local_1dda;
  allocator<char> local_1dd9 [31];
  allocator<char> local_1dba;
  allocator<char> local_1db9;
  undefined8 local_1db8;
  undefined8 uStack_1db0;
  undefined8 local_1da8;
  allocator<char> local_1d9a;
  allocator<char> local_1d99;
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  undefined8 local_1d88;
  allocator<char> local_1d7a;
  allocator<char> local_1d79;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  allocator<char> local_1d5a;
  allocator<char> local_1d59;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  allocator<char> local_1d3a;
  allocator<char> local_1d39;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  allocator<char> local_1d1a;
  allocator<char> local_1d19;
  undefined8 local_1d18;
  undefined8 uStack_1d10;
  undefined8 local_1d08;
  allocator<char> local_1cfa;
  allocator<char> local_1cf9;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  undefined8 local_1ce8;
  allocator<char> local_1cda;
  allocator<char> local_1cd9;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  allocator<char> local_1cba;
  allocator<char> local_1cb9;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  allocator<char> local_1c9a;
  allocator<char> local_1c99;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  allocator<char> local_1c7a;
  allocator<char> local_1c79 [31];
  allocator<char> local_1c5a;
  allocator<char> local_1c59 [30];
  allocator<char> local_1c3b;
  undefined1 local_1c3a;
  allocator<char> local_1c39 [2];
  allocator<char> local_1c37;
  allocator<char> local_1c36;
  allocator<char> local_1c35;
  allocator<char> local_1c34;
  allocator<char> local_1c33;
  allocator<char> local_1c32;
  allocator<char> local_1c31 [31];
  allocator<char> local_1c12;
  allocator<char> local_1c11 [1409];
  undefined1 local_1690 [544];
  undefined1 local_1470 [320];
  undefined1 local_1330 [680];
  undefined1 local_1088 [136];
  undefined8 local_1000;
  undefined1 local_dc8 [1496];
  undefined1 local_7f0 [200];
  undefined1 local_728;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined1 local_6e8;
  undefined1 local_6e7;
  undefined1 local_5e8 [64];
  undefined1 local_5a8 [64];
  undefined1 local_568;
  undefined1 local_567;
  undefined1 local_4a0;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined1 local_460;
  undefined1 local_45f;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  UniValue::UniValue<const_char_(&)[18],_char[18],_true>
            (in_stack_ffffffffffffdb60,(char (*) [18])in_stack_ffffffffffffdb58);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdb28,in_stack_ffffffffffffdb20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_4a0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdb30);
  local_478 = 0;
  uStack_470 = 0;
  local_468 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdb18);
  local_460 = 0;
  local_45f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
                 in_stack_ffffffffffffdb88,in_stack_ffffffffffffdb84,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdb7f,in_stack_ffffffffffffdb78),
                 in_stack_ffffffffffffdb70,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdb28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdb20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_5a8[0] = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffdb30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffdb18);
  __l._M_len._0_7_ = in_stack_ffffffffffffdb68;
  __l._M_array = (iterator)in_stack_ffffffffffffdb60;
  __l._M_len._7_1_ = in_stack_ffffffffffffdb6f;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdb58,__l,(allocator_type *)in_stack_ffffffffffffdb50);
  local_568 = 0;
  local_567 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
                 in_stack_ffffffffffffdb88,in_stack_ffffffffffffdb84,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdb7f,in_stack_ffffffffffffdb78),
                 in_stack_ffffffffffffdb70,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1c3a = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffdb58,(bool *)in_stack_ffffffffffffdb50);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdb28,in_stack_ffffffffffffdb20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_728 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdb30);
  local_700 = 0;
  uStack_6f8 = 0;
  local_6f0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdb18);
  local_6e8 = 0;
  local_6e7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
                 in_stack_ffffffffffffdb88,in_stack_ffffffffffffdb84,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdb7f,in_stack_ffffffffffffdb78),
                 in_stack_ffffffffffffdb70,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffdb18);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffdb68;
  __l_00._M_array = (iterator)in_stack_ffffffffffffdb60;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffdb6f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdb58,__l_00,
             (allocator_type *)in_stack_ffffffffffffdb50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1c98 = 0;
  uStack_1c90 = 0;
  local_1c88 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb18);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1cb8 = 0;
  uStack_1cb0 = 0;
  local_1ca8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb18);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1cd8 = 0;
  uStack_1cd0 = 0;
  local_1cc8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb18);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1cf8 = 0;
  uStack_1cf0 = 0;
  local_1ce8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb18);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1d18 = 0;
  uStack_1d10 = 0;
  local_1d08 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb18);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)
           ((ulong)in_stack_ffffffffffffdb18 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
             in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb88,
             SUB41(in_stack_ffffffffffffdb84 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdb7f,in_stack_ffffffffffffdb78),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb70,
             (bool)in_stack_ffffffffffffdb6f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1d38 = 0;
  uStack_1d30 = 0;
  local_1d28 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
             in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb88,
             SUB41(in_stack_ffffffffffffdb84 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdb7f,in_stack_ffffffffffffdb78),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb70,
             (bool)in_stack_ffffffffffffdb6f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1d58 = 0;
  uStack_1d50 = 0;
  local_1d48 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
             in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb88,
             SUB41(in_stack_ffffffffffffdb84 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdb7f,in_stack_ffffffffffffdb78),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb70,
             (bool)in_stack_ffffffffffffdb6f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1d78 = 0;
  uStack_1d70 = 0;
  local_1d68 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
             in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb88,
             SUB41(in_stack_ffffffffffffdb84 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdb7f,in_stack_ffffffffffffdb78),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb70,
             (bool)in_stack_ffffffffffffdb6f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1d98 = 0;
  uStack_1d90 = 0;
  local_1d88 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1db8 = 0;
  uStack_1db0 = 0;
  local_1da8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  paVar3 = (allocator<RPCResult> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
             in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb88,
             SUB41(in_stack_ffffffffffffdb84 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdb7f,in_stack_ffffffffffffdb78),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb70,
             (bool)in_stack_ffffffffffffdb6f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1df8 = 0;
  uStack_1df0 = 0;
  local_1de8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1e18 = 0;
  uStack_1e10 = 0;
  local_1e08 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1e38 = (pointer)0x0;
  uStack_1e30._0_1_ = false;
  uStack_1e30._1_1_ = false;
  uStack_1e30._2_6_ = 0;
  local_1e28 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1e58._M_allocated_capacity = 0;
  local_1e58._8_8_ = 0;
  local_1e48 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  fun = (RPCMethodImpl *)local_1e7a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1e98._0_1_ = '\0';
  local_1e98._1_7_ = 0;
  _Stack_1e90._M_p = (pointer)0x0;
  local_1e88 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1eb9[1] = (allocator<char>)0x0;
  local_1eb9[2] = (allocator<char>)0x0;
  local_1eb9[3] = (allocator<char>)0x0;
  local_1eb9[4] = (allocator<char>)0x0;
  local_1eb9[5] = (allocator<char>)0x0;
  local_1eb9[6] = (allocator<char>)0x0;
  local_1eb9[7] = (allocator<char>)0x0;
  local_1eb9[8] = (allocator<char>)0x0;
  local_1eb9._9_8_ = 0;
  local_1eb9._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1ed9._1_8_ = 0;
  local_1ed9._9_8_ = 0;
  local_1ed9._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  local_1efc[4] = (allocator<char>)0x0;
  local_1efc[5] = (allocator<char>)0x0;
  local_1efc[6] = (allocator<char>)0x0;
  local_1efc[7] = (allocator<char>)0x0;
  local_1efc[8] = (allocator<char>)0x0;
  local_1efc[9] = (allocator<char>)0x0;
  local_1efc[10] = (allocator<char>)0x0;
  local_1efc[0xb] = (allocator<char>)0x0;
  auStack_1ef0._0_8_ = 0;
  auStack_1ef0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffdb68;
  __l_01._M_array = (iterator)in_stack_ffffffffffffdb60;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffdb6f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb58,__l_01,
             (allocator_type *)in_stack_ffffffffffffdb50);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffdb68;
  __l_02._M_array = (iterator)in_stack_ffffffffffffdb60;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffdb6f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb58,__l_02,
             (allocator_type *)in_stack_ffffffffffffdb50);
  paVar3 = (allocator<RPCResult> *)((ulong)paVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
             in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb88,
             SUB41(in_stack_ffffffffffffdb84 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdb7f,in_stack_ffffffffffffdb78),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb70,
             (bool)in_stack_ffffffffffffdb6f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffdb68;
  __l_03._M_array = (iterator)in_stack_ffffffffffffdb60;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffdb6f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb58,__l_03,
             (allocator_type *)in_stack_ffffffffffffdb50);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb9c,
             (string *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
             in_stack_ffffffffffffdb88,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80),
             (bool)in_stack_ffffffffffffdb7f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffdb9c,in_stack_ffffffffffffdb98),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  HelpExampleCli(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  HelpExampleCli(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::operator+(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  HelpExampleCli(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::operator+(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  HelpExampleCli(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::operator+(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  HelpExampleCli(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::operator+(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  HelpExampleRpc(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::operator+(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  HelpExampleRpc(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::operator+(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  this_00 = (RPCHelpMan *)local_1f0a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  name = (string *)&local_1f0b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  HelpExampleRpc(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::operator+(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  description = (string *)&local_1f0c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_1f0d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdb6f,in_stack_ffffffffffffdb68),
             (char *)in_stack_ffffffffffffdb60,(allocator<char> *)in_stack_ffffffffffffdb58);
  HelpExampleRpc(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  std::operator+(in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48);
  RPCExamples::RPCExamples((RPCExamples *)paVar3,(string *)0x55e862);
  this = (RPCArg *)local_1f30;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<gettxoutsetinfo()::__0,void>
            (in_stack_ffffffffffffdb28,(anon_class_1_0_00000001 *)in_stack_ffffffffffffdb20);
  RPCHelpMan::RPCHelpMan
            (this_00,name,description,args,(RPCResults *)this,in_stack_ffffffffffffdc60,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f0d);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f0c);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f0b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1f0a);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1f0a + 1));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1f08);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1f07);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1f06);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1f05);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1f04);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1f03);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1f02);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1f01);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1f00);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1eff);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1efe);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1efd);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1efc);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar1 = local_7f0;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != local_dc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_23b8 = local_1088;
  do {
    local_23b8 = local_23b8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_23b8 != local_1330);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_23d0 = local_1470;
  do {
    local_23d0 = local_23d0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_23d0 != local_1690);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(auStack_1ef0 + 0x16));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1ed9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1eba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1eb9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1e9a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1e99);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1e7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1e7a + 1));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1e5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1e59);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1e3a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1e39);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1e1a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1e19);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1dfa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1df9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1dda);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1dd9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1dba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1db9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1d9a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1d99);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1d7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1d79);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1d5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1d59);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1d3a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1d39);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1d1a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1d19);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1cfa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1cf9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1cda);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1cd9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1cba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1cb9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c9a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c99);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdb28);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1c79);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1c59);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdb28);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_23e8 = local_48;
  do {
    local_23e8 = local_23e8 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_23e8 != local_360);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c3b);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1c39);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this);
  local_2400 = local_5a8;
  do {
    local_2400 = local_2400 + -0x20;
    std::__cxx11::string::~string(&this->m_names);
  } while (local_2400 != local_5e8);
  std::allocator<char>::~allocator(&local_1c37);
  std::allocator<char>::~allocator(&local_1c36);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c35);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c34);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c33);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c32);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1c31);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1c12);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1c11);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan gettxoutsetinfo()
{
    return RPCHelpMan{"gettxoutsetinfo",
                "\nReturns statistics about the unspent transaction output set.\n"
                "Note this call may take some time if you are not using coinstatsindex.\n",
                {
                    {"hash_type", RPCArg::Type::STR, RPCArg::Default{"hash_serialized_3"}, "Which UTXO set hash should be calculated. Options: 'hash_serialized_3' (the legacy algorithm), 'muhash', 'none'."},
                    {"hash_or_height", RPCArg::Type::NUM, RPCArg::DefaultHint{"the current best block"}, "The block hash or height of the target height (only available with coinstatsindex).",
                     RPCArgOptions{
                         .skip_type_check = true,
                         .type_str = {"", "string or numeric"},
                     }},
                    {"use_index", RPCArg::Type::BOOL, RPCArg::Default{true}, "Use coinstatsindex, if available."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::NUM, "height", "The block height (index) of the returned statistics"},
                        {RPCResult::Type::STR_HEX, "bestblock", "The hash of the block at which these statistics are calculated"},
                        {RPCResult::Type::NUM, "txouts", "The number of unspent transaction outputs"},
                        {RPCResult::Type::NUM, "bogosize", "Database-independent, meaningless metric indicating the UTXO set size"},
                        {RPCResult::Type::STR_HEX, "hash_serialized_3", /*optional=*/true, "The serialized hash (only present if 'hash_serialized_3' hash_type is chosen)"},
                        {RPCResult::Type::STR_HEX, "muhash", /*optional=*/true, "The serialized hash (only present if 'muhash' hash_type is chosen)"},
                        {RPCResult::Type::NUM, "transactions", /*optional=*/true, "The number of transactions with unspent outputs (not available when coinstatsindex is used)"},
                        {RPCResult::Type::NUM, "disk_size", /*optional=*/true, "The estimated size of the chainstate on disk (not available when coinstatsindex is used)"},
                        {RPCResult::Type::STR_AMOUNT, "total_amount", "The total amount of coins in the UTXO set"},
                        {RPCResult::Type::STR_AMOUNT, "total_unspendable_amount", /*optional=*/true, "The total amount of coins permanently excluded from the UTXO set (only available if coinstatsindex is used)"},
                        {RPCResult::Type::OBJ, "block_info", /*optional=*/true, "Info on amounts in the block at this block height (only available if coinstatsindex is used)",
                        {
                            {RPCResult::Type::STR_AMOUNT, "prevout_spent", "Total amount of all prevouts spent in this block"},
                            {RPCResult::Type::STR_AMOUNT, "coinbase", "Coinbase subsidy amount of this block"},
                            {RPCResult::Type::STR_AMOUNT, "new_outputs_ex_coinbase", "Total amount of new outputs created by this block"},
                            {RPCResult::Type::STR_AMOUNT, "unspendable", "Total amount of unspendable outputs created in this block"},
                            {RPCResult::Type::OBJ, "unspendables", "Detailed view of the unspendable categories",
                            {
                                {RPCResult::Type::STR_AMOUNT, "genesis_block", "The unspendable amount of the Genesis block subsidy"},
                                {RPCResult::Type::STR_AMOUNT, "bip30", "Transactions overridden by duplicates (no longer possible with BIP30)"},
                                {RPCResult::Type::STR_AMOUNT, "scripts", "Amounts sent to scripts that are unspendable (for example OP_RETURN outputs)"},
                                {RPCResult::Type::STR_AMOUNT, "unclaimed_rewards", "Fee rewards that miners did not claim in their coinbase transaction"},
                            }}
                        }},
                    }},
                RPCExamples{
                    HelpExampleCli("gettxoutsetinfo", "") +
                    HelpExampleCli("gettxoutsetinfo", R"("none")") +
                    HelpExampleCli("gettxoutsetinfo", R"("none" 1000)") +
                    HelpExampleCli("gettxoutsetinfo", R"("none" '"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09"')") +
                    HelpExampleCli("-named gettxoutsetinfo", R"(hash_type='muhash' use_index='false')") +
                    HelpExampleRpc("gettxoutsetinfo", "") +
                    HelpExampleRpc("gettxoutsetinfo", R"("none")") +
                    HelpExampleRpc("gettxoutsetinfo", R"("none", 1000)") +
                    HelpExampleRpc("gettxoutsetinfo", R"("none", "00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09")")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue ret(UniValue::VOBJ);

    const CBlockIndex* pindex{nullptr};
    const CoinStatsHashType hash_type{request.params[0].isNull() ? CoinStatsHashType::HASH_SERIALIZED : ParseHashType(request.params[0].get_str())};
    bool index_requested = request.params[2].isNull() || request.params[2].get_bool();

    NodeContext& node = EnsureAnyNodeContext(request.context);
    ChainstateManager& chainman = EnsureChainman(node);
    Chainstate& active_chainstate = chainman.ActiveChainstate();
    active_chainstate.ForceFlushStateToDisk();

    CCoinsView* coins_view;
    BlockManager* blockman;
    {
        LOCK(::cs_main);
        coins_view = &active_chainstate.CoinsDB();
        blockman = &active_chainstate.m_blockman;
        pindex = blockman->LookupBlockIndex(coins_view->GetBestBlock());
    }

    if (!request.params[1].isNull()) {
        if (!g_coin_stats_index) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Querying specific block heights requires coinstatsindex");
        }

        if (hash_type == CoinStatsHashType::HASH_SERIALIZED) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "hash_serialized_3 hash type cannot be queried for a specific block");
        }

        if (!index_requested) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot set use_index to false when querying for a specific block");
        }
        pindex = ParseHashOrHeight(request.params[1], chainman);
    }

    if (index_requested && g_coin_stats_index) {
        if (!g_coin_stats_index->BlockUntilSyncedToCurrentChain()) {
            const IndexSummary summary{g_coin_stats_index->GetSummary()};

            // If a specific block was requested and the index has already synced past that height, we can return the
            // data already even though the index is not fully synced yet.
            if (pindex->nHeight > summary.best_block_height) {
                throw JSONRPCError(RPC_INTERNAL_ERROR, strprintf("Unable to get data because coinstatsindex is still syncing. Current height: %d", summary.best_block_height));
            }
        }
    }

    const std::optional<CCoinsStats> maybe_stats = GetUTXOStats(coins_view, *blockman, hash_type, node.rpc_interruption_point, pindex, index_requested);
    if (maybe_stats.has_value()) {
        const CCoinsStats& stats = maybe_stats.value();
        ret.pushKV("height", (int64_t)stats.nHeight);
        ret.pushKV("bestblock", stats.hashBlock.GetHex());
        ret.pushKV("txouts", (int64_t)stats.nTransactionOutputs);
        ret.pushKV("bogosize", (int64_t)stats.nBogoSize);
        if (hash_type == CoinStatsHashType::HASH_SERIALIZED) {
            ret.pushKV("hash_serialized_3", stats.hashSerialized.GetHex());
        }
        if (hash_type == CoinStatsHashType::MUHASH) {
            ret.pushKV("muhash", stats.hashSerialized.GetHex());
        }
        CHECK_NONFATAL(stats.total_amount.has_value());
        ret.pushKV("total_amount", ValueFromAmount(stats.total_amount.value()));
        if (!stats.index_used) {
            ret.pushKV("transactions", static_cast<int64_t>(stats.nTransactions));
            ret.pushKV("disk_size", stats.nDiskSize);
        } else {
            ret.pushKV("total_unspendable_amount", ValueFromAmount(stats.total_unspendable_amount));

            CCoinsStats prev_stats{};
            if (pindex->nHeight > 0) {
                const std::optional<CCoinsStats> maybe_prev_stats = GetUTXOStats(coins_view, *blockman, hash_type, node.rpc_interruption_point, pindex->pprev, index_requested);
                if (!maybe_prev_stats) {
                    throw JSONRPCError(RPC_INTERNAL_ERROR, "Unable to read UTXO set");
                }
                prev_stats = maybe_prev_stats.value();
            }

            UniValue block_info(UniValue::VOBJ);
            block_info.pushKV("prevout_spent", ValueFromAmount(stats.total_prevout_spent_amount - prev_stats.total_prevout_spent_amount));
            block_info.pushKV("coinbase", ValueFromAmount(stats.total_coinbase_amount - prev_stats.total_coinbase_amount));
            block_info.pushKV("new_outputs_ex_coinbase", ValueFromAmount(stats.total_new_outputs_ex_coinbase_amount - prev_stats.total_new_outputs_ex_coinbase_amount));
            block_info.pushKV("unspendable", ValueFromAmount(stats.total_unspendable_amount - prev_stats.total_unspendable_amount));

            UniValue unspendables(UniValue::VOBJ);
            unspendables.pushKV("genesis_block", ValueFromAmount(stats.total_unspendables_genesis_block - prev_stats.total_unspendables_genesis_block));
            unspendables.pushKV("bip30", ValueFromAmount(stats.total_unspendables_bip30 - prev_stats.total_unspendables_bip30));
            unspendables.pushKV("scripts", ValueFromAmount(stats.total_unspendables_scripts - prev_stats.total_unspendables_scripts));
            unspendables.pushKV("unclaimed_rewards", ValueFromAmount(stats.total_unspendables_unclaimed_rewards - prev_stats.total_unspendables_unclaimed_rewards));
            block_info.pushKV("unspendables", std::move(unspendables));

            ret.pushKV("block_info", std::move(block_info));
        }
    } else {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "Unable to read UTXO set");
    }
    return ret;
},
    };
}